

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O0

IntRangeValueInfo *
IntRangeValueInfo::New
          (JitArenaAllocator *allocator,int32 lowerBound,int32 upperBound,
          bool wasNegativeZeroPreventedByBailout)

{
  JitArenaAllocator *alloc;
  IntRangeValueInfo *this;
  IntConstantBounds local_60;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  byte local_19;
  int32 local_18;
  int32 iStack_14;
  bool wasNegativeZeroPreventedByBailout_local;
  int32 upperBound_local;
  int32 lowerBound_local;
  JitArenaAllocator *allocator_local;
  
  local_19 = wasNegativeZeroPreventedByBailout;
  local_18 = upperBound;
  iStack_14 = lowerBound;
  _upperBound_local = allocator;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
             ,0x1a5);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator
                     ,&local_48);
  local_58 = Memory::JitArenaAllocator::Alloc;
  local_50 = 0;
  this = (IntRangeValueInfo *)new<Memory::JitArenaAllocator>(0x28,alloc,0x4e98c0);
  IntConstantBounds::IntConstantBounds(&local_60,iStack_14,local_18);
  IntRangeValueInfo(this,&local_60,(bool)(local_19 & 1),IntRange);
  return this;
}

Assistant:

static IntRangeValueInfo *New(
        JitArenaAllocator *const allocator,
        const int32 lowerBound,
        const int32 upperBound,
        const bool wasNegativeZeroPreventedByBailout)
    {
        return
            JitAnew(
                allocator,
                IntRangeValueInfo,
                IntConstantBounds(lowerBound, upperBound),
                wasNegativeZeroPreventedByBailout);
    }